

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Temporary.cpp
# Opt level: O3

void __thiscall IRT::Temporary::Temporary(Temporary *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint __val;
  long lVar2;
  int iVar3;
  long *plVar4;
  uint uVar5;
  size_type *psVar6;
  ulong uVar7;
  uint uVar8;
  uint __len;
  size_type *local_50;
  string __str;
  
  __val = -counter_;
  if (0 < counter_) {
    __val = counter_;
  }
  __len = 1;
  if (9 < __val) {
    uVar7 = (ulong)__val;
    uVar8 = 4;
    do {
      __len = uVar8;
      uVar5 = (uint)uVar7;
      if (uVar5 < 100) {
        __len = __len - 2;
        goto LAB_00124415;
      }
      if (uVar5 < 1000) {
        __len = __len - 1;
        goto LAB_00124415;
      }
      if (uVar5 < 10000) goto LAB_00124415;
      uVar7 = uVar7 / 10000;
      uVar8 = __len + 4;
    } while (99999 < uVar5);
    __len = __len + 1;
  }
LAB_00124415:
  uVar8 = (uint)counter_ >> 0x1f;
  iVar3 = counter_ >> 0x1f;
  local_50 = &__str._M_string_length;
  counter_ = counter_ + 1;
  std::__cxx11::string::_M_construct((ulong)&local_50,(char)__len - (char)iVar3);
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((long)local_50 + (ulong)uVar8),__len,__val);
  plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,0x12a6ad);
  paVar1 = &(this->name_).field_2;
  (this->name_)._M_dataplus._M_p = (pointer)paVar1;
  psVar6 = (size_type *)(plVar4 + 2);
  if ((size_type *)*plVar4 == psVar6) {
    lVar2 = plVar4[3];
    paVar1->_M_allocated_capacity = *psVar6;
    *(long *)((long)&(this->name_).field_2 + 8) = lVar2;
  }
  else {
    (this->name_)._M_dataplus._M_p = (pointer)*plVar4;
    (this->name_).field_2._M_allocated_capacity = *psVar6;
  }
  (this->name_)._M_string_length = plVar4[1];
  *plVar4 = (long)psVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  if (local_50 != &__str._M_string_length) {
    operator_delete(local_50,__str._M_string_length + 1);
  }
  return;
}

Assistant:

IRT::Temporary::Temporary(): name_("%" + std::to_string(counter_++)) {

}